

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuBackend.cpp
# Opt level: O3

void __thiscall xmrig::CpuBackend::start(CpuBackend *this,IWorker *worker,bool ready)

{
  size_t *psVar1;
  CpuBackendPrivate *pCVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar9;
  long lVar10;
  char *pcVar11;
  ulong uVar12;
  char *pcVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  
  iVar8 = pthread_mutex_lock((pthread_mutex_t *)mutex);
  if (iVar8 != 0) {
    std::__throw_system_error(iVar8);
  }
  pCVar2 = this->d_ptr;
  if (ready) {
    iVar8 = (*worker->_vptr_IWorker[3])(worker);
    uVar12 = *(long *)CONCAT44(extraout_var,iVar8) + 0x1fffffU >> 0x15;
    psVar1 = &(pCVar2->status).m_hugePages;
    *psVar1 = *psVar1 + (uVar12 & -(ulong)((uint)((long *)CONCAT44(extraout_var,iVar8))[2] & 1));
    (pCVar2->status).m_pages = uVar12 + (pCVar2->status).m_pages;
    (pCVar2->status).m_started = (pCVar2->status).m_started + 1;
    iVar8 = (*worker->_vptr_IWorker[5])(worker);
    psVar1 = &(pCVar2->status).m_ways;
    *psVar1 = *psVar1 + CONCAT44(extraout_var_00,iVar8);
    sVar9 = (pCVar2->status).m_errors;
  }
  else {
    sVar9 = (pCVar2->status).m_errors + 1;
    (pCVar2->status).m_errors = sVar9;
  }
  if (sVar9 + (pCVar2->status).m_started == (pCVar2->status).m_threads) {
    pCVar2 = this->d_ptr;
    sVar9 = (pCVar2->status).m_started;
    if (sVar9 == 0) {
      Log::print(ERR,"%s \x1b[1;31mdisabled\x1b[0m\x1b[0;33m (failed to start threads)\x1b[0m",
                 "\x1b[46;1m\x1b[1;37m cpu \x1b[0m");
    }
    else {
      pcVar11 = "\x1b[1;36m";
      if ((pCVar2->status).m_errors != 0) {
        pcVar11 = "\x1b[1;33m";
      }
      sVar3 = (pCVar2->status).m_threads;
      sVar4 = (pCVar2->status).m_ways;
      sVar5 = (pCVar2->status).m_hugePages;
      sVar6 = (pCVar2->status).m_pages;
      pcVar13 = "\x1b[1;31m";
      dVar16 = 0.0;
      if (sVar5 != 0) {
        pcVar13 = "\x1b[1;33m";
        auVar14._8_4_ = (int)(sVar5 >> 0x20);
        auVar14._0_8_ = sVar5;
        auVar14._12_4_ = 0x45300000;
        auVar15._8_4_ = (int)(sVar6 >> 0x20);
        auVar15._0_8_ = sVar6;
        auVar15._12_4_ = 0x45300000;
        dVar16 = (((auVar14._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0)) * 100.0) /
                 ((auVar15._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0));
      }
      if (sVar5 == sVar6) {
        pcVar13 = "\x1b[1;32m";
      }
      sVar7 = (pCVar2->status).m_memory;
      lVar10 = std::chrono::_V2::steady_clock::now();
      Log::print(INFO,
                 "%s\x1b[1;32m READY\x1b[0m threads %s%zu/%zu (%zu)\x1b[0m huge pages %s%1.0f%% %zu/%zu\x1b[0m memory \x1b[1;36m%zu KB\x1b[0m\x1b[1;30m (%lu ms)\x1b[0m"
                 ,dVar16,"\x1b[46;1m\x1b[1;37m cpu \x1b[0m",pcVar11,sVar9,sVar3,sVar4,pcVar13,sVar5,
                 sVar6,sVar7 * sVar4 >> 10,lVar10 / 1000000 - (pCVar2->status).m_ts);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)mutex);
  if (!ready) {
    return;
  }
  (*worker->_vptr_IWorker[8])(worker);
  return;
}

Assistant:

void xmrig::CpuBackend::start(IWorker *worker, bool ready)
{
    mutex.lock();

    if (d_ptr->status.started(worker, ready)) {
        d_ptr->status.print();
    }

    mutex.unlock();

    if (ready) {
        worker->start();
    }
}